

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
::find<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,bool>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  size_t hash;
  string_view v;
  iterator iVar1;
  
  AssertHashEqConsistent<std::__cxx11::string>(this,key);
  v._M_str = (key->_M_dataplus)._M_p;
  v._M_len = key->_M_string_length;
  hash = StringHash::operator()((StringHash *)this,v);
  iVar1 = find_non_soo<std::__cxx11::string>(this,key,hash);
  return iVar1;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }